

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Type __thiscall
wabt::anon_unknown_4::Validator::GetDeclarationType(Validator *this,FuncDeclaration *decl)

{
  pointer pTVar1;
  pointer pTVar2;
  uint uVar3;
  Type TVar4;
  ulong uVar5;
  
  if (decl->has_func_type == true) {
    if ((decl->type_var).type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3b,"Index wabt::Var::index() const");
    }
    uVar3 = (decl->type_var).field_2.index_;
LAB_00151216:
    TVar4.type_index_ = 0;
    TVar4.enum_ = uVar3;
    if (uVar3 == 0xffffffeb) {
      __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                    ,0x40,"wabt::Type::Type(int32_t)");
    }
  }
  else {
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00151211:
      uVar3 = Module::GetFuncTypeIndex((Module *)this,decl);
      goto LAB_00151216;
    }
    pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar1 != pTVar2) {
      if ((long)pTVar2 - (long)pTVar1 == 8) {
        TVar4 = *pTVar1;
        uVar5 = (ulong)TVar4 & 0xffffffff00000000;
        goto LAB_0015121d;
      }
      goto LAB_00151211;
    }
    TVar4.enum_ = Void;
    TVar4.type_index_ = 0;
  }
  uVar5 = 0;
LAB_0015121d:
  return (Type)((ulong)TVar4 & 0xffffffff | uVar5);
}

Assistant:

Type Validator::GetDeclarationType(const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    return Type(decl.type_var.index());
  }
  if (decl.sig.param_types.empty()) {
    if (decl.sig.result_types.empty()) {
      return Type::Void;
    }
    if (decl.sig.result_types.size() == 1) {
      return decl.sig.result_types[0];
    }
  }
  return Type(current_module_->GetFuncTypeIndex(decl));
}